

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  Ch *pCVar5;
  Number NVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar14;
  byte *pbVar15;
  undefined4 uVar16;
  char *pcVar17;
  byte bVar18;
  uint16_t uVar19;
  uint uVar20;
  ulong uVar21;
  SizeType SVar22;
  ushort uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  byte *pbVar27;
  ulong uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uStack_48;
  uint uStack_44;
  
  bVar2 = *is->src_;
  if (bVar2 < 0x6e) {
    if (bVar2 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar2 != 0x5b) {
      if (bVar2 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar4 = is->src_;
      if (*pcVar4 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x373,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pcVar17 = pcVar4 + 1;
      is->src_ = pcVar17;
      if (pcVar4[1] == 'a') {
        pcVar17 = pcVar4 + 2;
        is->src_ = pcVar17;
        if (pcVar4[2] == 'l') {
          pcVar17 = pcVar4 + 3;
          is->src_ = pcVar17;
          if (pcVar4[3] == 's') {
            pcVar17 = pcVar4 + 4;
            is->src_ = pcVar17;
            if (pcVar4[4] == 'e') {
              is->src_ = pcVar4 + 5;
              pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
                        Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                  (&handler->stack_,1);
              (pGVar14->data_).n = (Number)0x0;
              (pGVar14->data_).s.str = (Ch *)0x0;
              (pGVar14->data_).f.flags = 9;
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar5 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(long *)(this + 0x38) = (long)pcVar17 - (long)pCVar5;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x37b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x329,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar14->data_).n = (Number)0x0;
    (pGVar14->data_).s.str = (Ch *)0x0;
    (pGVar14->data_).f.flags = 4;
    pbVar15 = (byte *)is->src_;
    while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))) {
      pbVar15 = pbVar15 + 1;
    }
    is->src_ = (Ch *)pbVar15;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar15 == 0x5d) {
        is->src_ = (Ch *)(pbVar15 + 1);
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (!bVar10) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x334,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_001364e6:
          pbVar15 = (byte *)is->src_;
          uVar16 = 0x10;
LAB_001364ee:
          pCVar5 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar16;
          *(long *)(this + 0x38) = (long)pbVar15 - (long)pCVar5;
        }
      }
      else {
        ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) == 0) {
          SVar22 = 0;
          do {
            pbVar15 = (byte *)is->src_;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            SVar22 = SVar22 + 1;
            is->src_ = (Ch *)pbVar15;
            if (*pbVar15 != 0x2c) {
              if (*pbVar15 != 0x5d) {
                uVar16 = 7;
                goto LAB_001364ee;
              }
              is->src_ = (Ch *)(pbVar15 + 1);
              bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndArray(handler,SVar22);
              if (bVar10) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                              ,0x346,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_001364e6;
            }
            pbVar15 = pbVar15 + 1;
            is->src_ = (Ch *)pbVar15;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            is->src_ = (Ch *)pbVar15;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
          } while (*(int *)(this + 0x30) == 0);
        }
      }
    }
    return;
  }
  if (bVar2 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x2e5,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar14->data_).n = (Number)0x0;
    (pGVar14->data_).s.str = (Ch *)0x0;
    (pGVar14->data_).f.flags = 3;
    pbVar15 = (byte *)is->src_;
    while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))) {
      pbVar15 = pbVar15 + 1;
    }
    is->src_ = (Ch *)pbVar15;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar15 == 0x7d) {
        is->src_ = (Ch *)(pbVar15 + 1);
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar10) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x2f0,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0013633f:
        pbVar15 = (byte *)is->src_;
        uVar16 = 0x10;
      }
      else {
        if (*pbVar15 == 0x22) {
          SVar22 = 0;
          do {
            ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar15 = (byte *)is->src_;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            is->src_ = (Ch *)pbVar15;
            if (*pbVar15 != 0x3a) {
              uVar16 = 5;
              goto LAB_00136390;
            }
            pbVar15 = pbVar15 + 1;
            is->src_ = (Ch *)pbVar15;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            is->src_ = (Ch *)pbVar15;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar15 = (byte *)is->src_;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            is->src_ = (Ch *)pbVar15;
            SVar22 = SVar22 + 1;
            if (*pbVar15 != 0x2c) {
              if (*pbVar15 != 0x7d) {
                uVar16 = 6;
                goto LAB_00136390;
              }
              is->src_ = (Ch *)(pbVar15 + 1);
              bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndObject(handler,SVar22);
              if (bVar10) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                              ,0x315,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_0013633f;
            }
            pbVar15 = pbVar15 + 1;
            is->src_ = (Ch *)pbVar15;
            while (((ulong)*pbVar15 < 0x21 && ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))
                  ) {
              pbVar15 = pbVar15 + 1;
            }
            is->src_ = (Ch *)pbVar15;
          } while (*pbVar15 == 0x22);
        }
        uVar16 = 4;
      }
LAB_00136390:
      pCVar5 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar16;
      *(long *)(this + 0x38) = (long)pbVar15 - (long)pCVar5;
    }
    return;
  }
  if (bVar2 == 0x74) {
    pcVar4 = is->src_;
    if (*pcVar4 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x366,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar17 = pcVar4 + 1;
    is->src_ = pcVar17;
    if (pcVar4[1] == 'r') {
      pcVar17 = pcVar4 + 2;
      is->src_ = pcVar17;
      if (pcVar4[2] == 'u') {
        pcVar17 = pcVar4 + 3;
        is->src_ = pcVar17;
        if (pcVar4[3] == 'e') {
          is->src_ = pcVar4 + 4;
          pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar14->data_).n = (Number)0x0;
          (pGVar14->data_).s.str = (Ch *)0x0;
          (pGVar14->data_).f.flags = 10;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar5 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pcVar17 - (long)pCVar5;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                  ,0x36e,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar2 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar15 = pbVar3;
  bVar18 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar15 = pbVar3 + 1;
    bVar18 = pbVar3[1];
  }
  pCVar5 = is->head_;
  if (bVar18 == 0x30) {
    uVar20 = (uint)pbVar15[1];
    pbVar27 = pbVar15 + 1;
    dVar7 = 0.0;
    bVar10 = false;
    uVar28 = 0;
    bVar9 = false;
    iVar11 = 0;
    bVar8 = false;
    uVar26 = 0;
    goto LAB_0012e23e;
  }
  if ((byte)(bVar18 - 0x31) < 9) {
    uVar26 = bVar18 - 0x30;
    bVar18 = pbVar15[1];
    uVar21 = (ulong)bVar18;
    pbVar27 = pbVar15 + 1;
    dVar7 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar18 - 0x30) < 10) {
        iVar11 = 0;
LAB_0012e0aa:
        if (uVar26 < 0xccccccc) {
LAB_0012e0b3:
          uVar26 = (uVar26 * 10 + (int)uVar21) - 0x30;
          iVar11 = iVar11 + 1;
          bVar18 = pbVar27[1];
          uVar21 = (ulong)bVar18;
          pbVar27 = pbVar27 + 1;
          if (9 < (byte)(bVar18 - 0x30)) goto LAB_0012e18c;
          goto LAB_0012e0aa;
        }
        if (uVar26 != 0xccccccc) goto LAB_0012e12d;
        if ((byte)uVar21 < 0x39) goto LAB_0012e0b3;
        uVar26 = 0xccccccc;
        uVar21 = 0x39;
LAB_0012e12d:
        uVar28 = (ulong)uVar26;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar28) && (0x38 < (byte)uVar21 || uVar28 != 0xccccccccccccccc)
               ) goto LAB_0012e1dc;
            uVar28 = (uVar21 & 0xf) + uVar28 * 10;
            iVar11 = iVar11 + 1;
            bVar18 = pbVar27[1];
            uVar21 = (ulong)bVar18;
            pbVar27 = pbVar27 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar28) &&
               (0x35 < (byte)uVar21 || uVar28 != 0x1999999999999999)) goto LAB_0012e1dc;
            uVar28 = (uVar21 & 0xf) + uVar28 * 10;
            iVar11 = iVar11 + 1;
            bVar18 = pbVar27[1];
            uVar21 = (ulong)bVar18;
            pbVar27 = pbVar27 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        uVar20 = (uint)bVar18;
        dVar7 = 0.0;
        bVar8 = true;
        bVar10 = false;
        bVar9 = false;
        goto LAB_0012e23e;
      }
LAB_0012e71f:
      iVar11 = 0;
    }
    else {
      if (9 < (byte)(bVar18 - 0x30)) goto LAB_0012e71f;
      iVar11 = 0;
      do {
        if (0x19999998 < uVar26) {
          if (uVar26 != 0x19999999) goto LAB_0012e12d;
          if (0x35 < (byte)uVar21) {
            uVar26 = 0x19999999;
            goto LAB_0012e12d;
          }
        }
        uVar26 = (uVar26 * 10 + (int)uVar21) - 0x30;
        iVar11 = iVar11 + 1;
        bVar18 = pbVar27[1];
        uVar21 = (ulong)bVar18;
        pbVar27 = pbVar27 + 1;
      } while ((byte)(bVar18 - 0x30) < 10);
    }
LAB_0012e18c:
    uVar20 = (uint)bVar18;
    bVar10 = false;
    uVar28 = 0;
    bVar9 = false;
    bVar8 = false;
    goto LAB_0012e23e;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                  ,0x60c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar13 = (long)pbVar15 - (long)pCVar5;
  *(undefined4 *)(this + 0x30) = 3;
LAB_0012e4a1:
  *(long *)(this + 0x38) = lVar13;
  goto LAB_0012e704;
LAB_0012e468:
  do {
    pbVar15 = pbVar27 + 1;
    pbVar27 = pbVar27 + 1;
  } while ((byte)(*pbVar15 - 0x30) < 10);
LAB_0012e516:
  iVar11 = -iVar25;
  if (!bVar10) {
    iVar11 = iVar25;
  }
LAB_0012e523:
  if (bVar9) goto LAB_0012e528;
  pbVar15 = pbVar27;
  if (!bVar8) {
    if (bVar2 == 0x2d) {
      pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar14->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar14->data_ = (long)(int)-uVar26;
      uVar19 = 0xb6;
      if ((int)uVar26 < 1) {
        uVar19 = 0x1f6;
      }
      (pGVar14->data_).f.flags = uVar19;
    }
    else {
      pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar14->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar14->data_ = uVar21;
      (pGVar14->data_).f.flags = (ushort)(-1 < (int)uVar26) << 5 | 0x1d6;
    }
    goto LAB_0012e704;
  }
  if (bVar2 != 0x2d) {
    pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar14->data_).s.str = (Ch *)0x0;
    *(ulong *)&pGVar14->data_ = uVar28;
    uVar23 = (ushort)((uVar28 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
    if (uVar28 >> 0x20 != 0) {
      uVar23 = (ushort)(-1 < (long)uVar28) << 7 | 0x116;
    }
    (pGVar14->data_).f.flags = uVar23;
    goto LAB_0012e704;
  }
  bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           ::Int64(handler,-uVar28);
  if (bVar10) goto LAB_0012e704;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                  ,0x6d3,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_0012e6c3:
  *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar5;
  pbVar15 = pbVar27;
  goto LAB_0012e704;
LAB_0012e1dc:
  auVar30._8_4_ = (int)(uVar28 >> 0x20);
  auVar30._0_8_ = uVar28;
  auVar30._12_4_ = 0x45300000;
  dVar7 = (auVar30._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar28) - 4503599627370496.0);
  do {
    dVar7 = dVar7 * 10.0 + (double)((int)uVar21 + -0x30);
    bVar18 = pbVar27[1];
    uVar21 = (ulong)bVar18;
    uVar20 = (uint)bVar18;
    pbVar27 = pbVar27 + 1;
  } while ((byte)(bVar18 - 0x30) < 10);
  bVar10 = true;
  bVar9 = true;
  bVar8 = true;
LAB_0012e23e:
  uVar21 = (ulong)uVar26;
  if ((char)uVar20 != '.') {
    iVar24 = 0;
LAB_0012e39b:
    iVar11 = 0;
    if ((uVar20 | 0x20) == 0x65) {
      uVar12 = uVar21;
      if (bVar8) {
        uVar12 = uVar28;
      }
      if (!bVar9) {
        auVar32._8_4_ = (int)(uVar12 >> 0x20);
        auVar32._0_8_ = uVar12;
        auVar32._12_4_ = 0x45300000;
        dVar7 = (auVar32._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
        bVar9 = true;
      }
      bVar18 = pbVar27[1];
      bVar10 = bVar18 != 0x2b;
      if ((bVar10) && (bVar18 != 0x2d)) {
        if (9 < (byte)(bVar18 - 0x30)) {
          pbVar15 = pbVar27 + 1;
LAB_0012e47f:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x68c,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar13 = (long)pbVar15 - (long)pCVar5;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_0012e4a1;
        }
        pbVar27 = pbVar27 + 2;
        iVar25 = bVar18 - 0x30;
      }
      else {
        pbVar15 = pbVar27 + 2;
        if (9 < (byte)(*pbVar15 - 0x30)) {
          pbVar15 = pbVar27 + 2;
          goto LAB_0012e47f;
        }
        pbVar27 = pbVar27 + 3;
        iVar25 = *pbVar15 - 0x30;
        if (bVar18 != 0x2b) {
          if (0 < iVar24) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x677,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar18 = *pbVar27;
          if ((byte)(bVar18 - 0x30) < 10) {
            do {
              iVar25 = iVar25 * 10 + (uint)bVar18 + -0x30;
              if ((iVar24 + 0x7ffffff7) / 10 < iVar25) goto LAB_0012e468;
              pbVar27 = pbVar27 + 1;
              bVar18 = *pbVar27;
            } while ((byte)(bVar18 - 0x30) < 10);
          }
          else {
            bVar10 = true;
          }
          goto LAB_0012e516;
        }
      }
      do {
        bVar18 = *pbVar27;
        if (9 < (byte)(bVar18 - 0x30)) {
          bVar10 = false;
          goto LAB_0012e516;
        }
        pbVar27 = pbVar27 + 1;
        iVar25 = iVar25 * 10 + (uint)bVar18 + -0x30;
      } while (iVar25 <= 0x134 - iVar24);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x687,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar5;
      pbVar15 = pbVar27;
      goto LAB_0012e704;
    }
    goto LAB_0012e523;
  }
  uVar20 = (uint)pbVar27[1];
  pbVar15 = pbVar27 + 1;
  if ((byte)(pbVar27[1] - 0x3a) < 0xf6) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x637,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xe;
    *(long *)(this + 0x38) = (long)pbVar15 - (long)pCVar5;
    goto LAB_0012e704;
  }
  iVar24 = 0;
  if (bVar10) {
LAB_0012e2f0:
    do {
      pbVar27 = pbVar15;
      if (0x39 < (byte)uVar20) goto LAB_0012e39b;
      if (iVar11 < 0x11) {
        dVar7 = dVar7 * 10.0 + (double)(int)(uVar20 - 0x30);
        iVar24 = iVar24 + -1;
        if (0.0 < dVar7) {
          iVar11 = iVar11 + 1;
        }
      }
      pbVar1 = pbVar15 + 1;
      uVar20 = (uint)*pbVar1;
      pbVar27 = pbVar15 + 1;
      pbVar15 = pbVar27;
    } while ('/' < (char)*pbVar1);
    iVar11 = 0;
    goto LAB_0012e523;
  }
  if (!bVar8) {
    uVar28 = uVar21;
  }
  iVar24 = 0;
  do {
    if ((0x39 < (byte)uVar20) || (uVar28 >> 0x35 != 0)) {
      auVar31._8_4_ = (int)(uVar28 >> 0x20);
      auVar31._0_8_ = uVar28;
      auVar31._12_4_ = 0x45300000;
      dVar7 = (auVar31._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar28) - 4503599627370496.0);
      bVar9 = true;
      goto LAB_0012e2f0;
    }
    pbVar27 = pbVar15 + 1;
    iVar24 = iVar24 + -1;
    uVar28 = (ulong)(uVar20 - 0x30) + uVar28 * 10;
    iVar11 = iVar11 + (uint)(uVar28 != 0);
    pbVar1 = pbVar15 + 1;
    uVar20 = (uint)*pbVar1;
    pbVar15 = pbVar27;
  } while ('/' < (char)*pbVar1);
  dVar7 = (double)(long)uVar28;
  iVar11 = 0;
LAB_0012e528:
  uVar26 = iVar11 + iVar24;
  if ((int)uVar26 < -0x134) {
    dVar29 = 0.0;
    if (0xfffffd97 < uVar26) {
      dVar29 = (dVar7 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar26 - 0x134) * 8);
      goto LAB_0012e69f;
    }
  }
  else {
    if ((int)uVar26 < 0) {
      dVar29 = dVar7 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar26 * 8);
    }
    else {
      if (0x134 < uVar26) {
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      dVar29 = dVar7 * *(double *)(internal::Pow10(int)::e + (ulong)uVar26 * 8);
    }
LAB_0012e69f:
    if (1.79769313486232e+308 < dVar29) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x6bb,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_0012e6c3;
    }
  }
  pGVar14 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  uStack_48 = SUB84(dVar29,0);
  uStack_44 = (uint)((ulong)dVar29 >> 0x20);
  if (bVar2 == 0x2d) {
    uStack_44 = uStack_44 ^ 0x80000000;
  }
  (pGVar14->data_).s.str = (Ch *)0x216000000000000;
  NVar6.u64._4_4_ = uStack_44;
  NVar6.i.i = uStack_48;
  (pGVar14->data_).n = NVar6;
  pbVar15 = pbVar27;
LAB_0012e704:
  is->src_ = (Ch *)pbVar15;
  is->head_ = pCVar5;
  return;
}

Assistant:

Ch Peek() const { return *src_; }